

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestExtensionOrderings2::~TestExtensionOrderings2(TestExtensionOrderings2 *this)

{
  TestExtensionOrderings2 *this_local;
  
  ~TestExtensionOrderings2(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestExtensionOrderings2::~TestExtensionOrderings2() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestExtensionOrderings2)
  SharedDtor(*this);
}